

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_rules.cpp
# Opt level: O0

int64_t duckdb::ImplicitCastUhugeint(LogicalType *to)

{
  LogicalTypeId LVar1;
  LogicalType *in_RDI;
  LogicalType *in_stack_ffffffffffffffe8;
  undefined8 local_8;
  
  LVar1 = LogicalType::id(in_RDI);
  if ((byte)(LVar1 - DECIMAL) < 3) {
    local_8 = TargetTypeCost(in_stack_ffffffffffffffe8);
  }
  else {
    local_8 = -1;
  }
  return local_8;
}

Assistant:

static int64_t ImplicitCastUhugeint(const LogicalType &to) {
	switch (to.id()) {
	case LogicalTypeId::FLOAT:
	case LogicalTypeId::DOUBLE:
	case LogicalTypeId::DECIMAL:
		return TargetTypeCost(to);
	default:
		return -1;
	}
}